

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::serialize
          (XMLAbstractDoubleFloat *this,XSerializeEngine *serEng)

{
  bool bVar1;
  LiteralType local_1c;
  XSerializeEngine *pXStack_18;
  int type;
  XSerializeEngine *serEng_local;
  XMLAbstractDoubleFloat *this_local;
  
  pXStack_18 = serEng;
  serEng_local = (XSerializeEngine *)this;
  XMLNumber::serialize(&this->super_XMLNumber,serEng);
  bVar1 = XSerializeEngine::isStoring(pXStack_18);
  if (bVar1) {
    XSerializeEngine::operator<<(pXStack_18,this->fValue);
    XSerializeEngine::operator<<(pXStack_18,this->fType);
    XSerializeEngine::operator<<(pXStack_18,(bool)(this->fDataConverted & 1));
    XSerializeEngine::operator<<(pXStack_18,(bool)(this->fDataOverflowed & 1));
    XSerializeEngine::operator<<(pXStack_18,this->fSign);
    XSerializeEngine::writeString(pXStack_18,this->fRawData,0,false);
  }
  else {
    XSerializeEngine::operator>>(pXStack_18,&this->fValue);
    local_1c = NegINF;
    XSerializeEngine::operator>>(pXStack_18,(int *)&local_1c);
    this->fType = local_1c;
    XSerializeEngine::operator>>(pXStack_18,&this->fDataConverted);
    XSerializeEngine::operator>>(pXStack_18,&this->fDataOverflowed);
    XSerializeEngine::operator>>(pXStack_18,&this->fSign);
    XSerializeEngine::readString(pXStack_18,&this->fRawData);
    this->fFormattedString = (XMLCh *)0x0;
  }
  return;
}

Assistant:

void XMLAbstractDoubleFloat::serialize(XSerializeEngine& serEng)
{
    //REVISIT: may not need to call base since it does nothing
    XMLNumber::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng << fValue;
        serEng << fType;
        serEng << fDataConverted;
        serEng << fDataOverflowed;
        serEng << fSign;

        serEng.writeString(fRawData);

        // Do not serialize fFormattedString

    }
    else
    {
        serEng >> fValue;

        int type = 0;
        serEng >> type;
        fType = (LiteralType) type;

        serEng >> fDataConverted;
        serEng >> fDataOverflowed;
        serEng >> fSign;

        serEng.readString(fRawData);

        // Set it to 0 force it to re-format if needed
        fFormattedString = 0;

    }

}